

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleConfigLoader.cpp
# Opt level: O0

char * __thiscall SimpleConfigLoader::getConfigPath(SimpleConfigLoader *this)

{
  char *tpath;
  char *configPath;
  char *local_8;
  
  local_8 = get_env_var_path();
  if ((local_8 == (char *)0x0) && (local_8 = get_user_path(), local_8 == (char *)0x0)) {
    local_8 = strdup("/etc/softhsm2.conf");
  }
  return local_8;
}

Assistant:

char* SimpleConfigLoader::getConfigPath()
{
	char* configPath = get_env_var_path();
	char* tpath;

	if (configPath != NULL)
	{
		return configPath;
	}
	else
	{
		tpath = get_user_path();
		if (tpath != NULL)
		{
			return tpath;
		}
	}

	return strdup(DEFAULT_SOFTHSM2_CONF);
}